

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_server_transporter.cpp
# Opt level: O1

int __thiscall PipelineServerTransporter::pipe(PipelineServerTransporter *this,int *__pipedes)

{
  uv_pipe_t *handle;
  char *pcVar1;
  int iVar2;
  uv_loop_t *puVar3;
  char *__s;
  ulong in_RDX;
  string fullName;
  size_t len;
  uv_fs_t req;
  char tmp [2048];
  char *local_a18;
  char *local_a10;
  char local_a08 [16];
  size_t local_9f8;
  uv_fs_t local_9f0;
  char local_838 [2056];
  
  puVar3 = uv_default_loop();
  (this->super_Transporter).loop = puVar3;
  local_a18 = local_a08;
  local_a10 = (char *)0x0;
  local_a08[0] = '\0';
  local_9f8 = 0x800;
  uv_os_tmpdir(local_838,&local_9f8);
  pcVar1 = local_a10;
  strlen(local_838);
  std::__cxx11::string::_M_replace((ulong)&local_a18,0,pcVar1,(ulong)local_838);
  std::__cxx11::string::append((char *)&local_a18);
  std::__cxx11::string::_M_append((char *)&local_a18,*(ulong *)__pipedes);
  uv_fs_unlink((uv_loop_t *)0x0,&local_9f0,local_a18,(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&local_9f0);
  handle = &this->uvServer;
  (this->uvServer).data = this;
  uv_pipe_init((this->super_Transporter).loop,handle,0);
  iVar2 = uv_pipe_bind(handle,local_a18);
  if (iVar2 == 0) {
    iVar2 = uv_listen((uv_stream_t *)handle,0x80,onPipeConnectionCB);
    if (iVar2 == 0) {
      iVar2 = (int)CONCAT71((int7)((ulong)handle >> 8),1);
      Transporter::StartEventLoop(&this->super_Transporter);
      goto LAB_00138947;
    }
  }
  __s = uv_err_name(iVar2);
  pcVar1 = *(char **)(in_RDX + 8);
  strlen(__s);
  iVar2 = 0;
  std::__cxx11::string::_M_replace(in_RDX,0,pcVar1,(ulong)__s);
LAB_00138947:
  if (local_a18 != local_a08) {
    operator_delete(local_a18);
  }
  return iVar2;
}

Assistant:

bool PipelineServerTransporter::pipe(const std::string& name, std::string& err) {
	loop = uv_default_loop();
	std::string fullName;
#ifdef _WIN32
	{
		fullName = "\\\\.\\pipe\\emmylua-";
		fullName.append(name);
	}
#else
    {
		char tmp[2048];
		size_t len = sizeof(tmp);
		uv_os_tmpdir(tmp, &len);
		fullName = tmp;
		fullName.append("/");
		fullName.append(name);
        uv_fs_t req;
        uv_fs_unlink(nullptr, &req, fullName.c_str(), nullptr);
        uv_fs_req_cleanup(&req);
    }
#endif
	uvServer.data = this;
	uv_pipe_init(loop, &uvServer, 0);
	int r = uv_pipe_bind(&uvServer, fullName.c_str());
	if (r) {
		err = uv_err_name(r);
		return false;
	}
	r = uv_listen((uv_stream_t*)&uvServer, 128, onPipeConnectionCB);
	if (r) {
		err = uv_err_name(r);
		return false;
	}
	StartEventLoop();
	return true;
}